

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall pbrt::LightHandle::PDF_Le(LightHandle *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  bool bVar1;
  uint uVar2;
  GoniometricLight *this_00;
  PortalImageInfiniteLight *this_01;
  uint uVar3;
  float fVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  Float FVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  Vector3f d;
  Tuple2<pbrt::Point2,_float> TStack_28;
  undefined1 auVar7 [64];
  
  TStack_28 = (Tuple2<pbrt::Point2,_float>)
              (this->
              super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              ).bits;
  uVar3 = (uint)TStack_28.y._2_2_;
  if (4 < (ulong)TStack_28 >> 0x30) {
    uVar2 = TStack_28.y._2_2_ - 4;
    if (uVar2 < 3) {
      if (uVar2 == 2) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.h"
                 ,0x195,"Shouldn\'t be called for area lights");
      }
      SpotLight::PDF_Le((SpotLight *)((ulong)TStack_28 & 0xffffffffffff),ray,pdfPos,pdfDir);
      return;
    }
    this_01 = (PortalImageInfiniteLight *)((ulong)TStack_28 & 0xffffffffffff);
    if (1 < uVar3 - 6) {
      if (uVar3 - 6 == 2) {
        fVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
        fVar10 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
        fVar13 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
        auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this_01->super_LightBase).renderFromLight.
                                                         mInv.m[0][1])),ZEXT416((uint)fVar10),
                                  ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[0]
                                                [0]));
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this_01->super_LightBase).renderFromLight.
                                                        mInv.m[1][1])),ZEXT416((uint)fVar10),
                                 ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[1]
                                               [0]));
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this_01->super_LightBase).renderFromLight.
                                                        mInv.m[2][1])),ZEXT416((uint)fVar10),
                                 ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[2]
                                               [0]));
        auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar13),
                                  ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[0]
                                                [2]));
        auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar13),
                                 ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[1]
                                               [2]));
        auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar13),
                                 ZEXT416((uint)(this_01->super_LightBase).renderFromLight.mInv.m[2]
                                               [2]));
        auVar11 = vunpcklps_avx(auVar11,auVar9);
        d.super_Tuple3<pbrt::Vector3,_float>.z = -auVar6._0_4_;
        d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
        auVar7._0_8_ = EqualAreaSphereToSquare(d);
        auVar7._8_56_ = extraout_var;
        TStack_28 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7._0_16_);
        FVar5 = PiecewiseConstant2D::PDF
                          ((PiecewiseConstant2D *)&(this_01->image).p16.ptr,(Point2f *)&TStack_28);
        *pdfDir = FVar5 / 12.566371;
        fVar4 = *(float *)&(this_01->image).p16.alloc.memoryResource;
        *pdfPos = 1.0 / (fVar4 * fVar4 * 3.1415927);
        return;
      }
      PortalImageInfiniteLight::PDF_Le(this_01,ray,pdfPos,pdfDir);
      return;
    }
    *pdfDir = 0.07957747;
    fVar4 = (this_01->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z;
    *pdfPos = 1.0 / (fVar4 * fVar4 * 3.1415927);
    return;
  }
  if (uVar3 < 3) {
    if (uVar3 == 2) {
      fVar4 = *(float *)(((ulong)TStack_28 & 0xffffffffffff) + 0xd0);
      FVar8 = 1.0 / (fVar4 * fVar4 * 3.1415927);
      FVar5 = 0.0;
    }
    else {
      FVar5 = 0.07957747;
      FVar8 = 0.0;
    }
    *pdfPos = FVar8;
    *pdfDir = FVar5;
    return;
  }
  this_00 = (GoniometricLight *)((ulong)TStack_28 & 0xffffffffffff);
  if ((uVar3 & 6) == 2) {
    *pdfPos = 0.0;
    fVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar10 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar13 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this_00->super_LightBase).renderFromLight.mInv
                                                     .m[0][1])),ZEXT416((uint)fVar10),
                              ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[0][0])
                             );
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this_00->super_LightBase).renderFromLight.mInv.
                                                    m[1][1])),ZEXT416((uint)fVar10),
                             ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[1][0]))
    ;
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this_00->super_LightBase).renderFromLight.mInv.
                                                    m[2][1])),ZEXT416((uint)fVar10),
                             ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[2][0]))
    ;
    auVar12 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar13),
                              ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[0][2])
                             );
    auVar11 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar13),
                              ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[1][2])
                             );
    auVar9 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar13),
                             ZEXT416((uint)(this_00->super_LightBase).renderFromLight.mInv.m[2][2]))
    ;
    fVar4 = auVar12._0_4_;
    fVar10 = auVar11._0_4_;
    fVar14 = auVar9._0_4_;
    auVar11 = ZEXT416((uint)(fVar4 * fVar4 + fVar10 * fVar10 + fVar14 * fVar14));
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    fVar13 = auVar11._0_4_;
    auVar11._0_4_ = fVar14 / fVar13;
    auVar11._4_12_ = auVar9._4_12_;
    if (*(float *)((long)&(this_00->image).p32.ptr + 4) <= auVar11._0_4_) {
      fVar10 = fVar10 / fVar13;
      auVar6._0_4_ = fVar4 / fVar13;
      auVar6._4_12_ = auVar12._4_12_;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * *(float *)((long)&(this_00->image).p32.nAlloc
                                                                 + 4))),auVar6,
                               ZEXT416((uint)(this_00->image).p32.nAlloc));
      auVar9 = vfmadd231ss_fma(auVar9,auVar11,ZEXT416((uint)(this_00->image).p32.nStored));
      fVar4 = auVar9._0_4_ + *(float *)((long)&(this_00->image).p32.nStored + 4);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * *(float *)((long)&(this_00->distrib).
                                                                         pConditionalV.nAlloc + 4)))
                               ,auVar6,ZEXT416((uint)(this_00->distrib).pConditionalV.nAlloc));
      auVar9 = vfmadd231ss_fma(auVar9,auVar11,
                               ZEXT416((uint)(this_00->distrib).pConditionalV.nStored));
      fVar13 = auVar9._0_4_ + *(float *)((long)&(this_00->distrib).pConditionalV.nStored + 4);
      bVar1 = fVar13 == 1.0;
      fVar4 = (float)((uint)bVar1 * (int)fVar4 + (uint)!bVar1 * (int)(fVar4 / fVar13));
      if ((*(float *)((long)&(this_00->image).p16.nStored + 4) <= fVar4) &&
         (fVar4 <= *(float *)((long)&(this_00->image).p32.alloc.memoryResource + 4))) {
        auVar9 = vfmadd132ss_fma(auVar6,ZEXT416((uint)(fVar10 * (this_00->distrib).domain.pMin.
                                                                super_Tuple2<pbrt::Point2,_float>.y)
                                               ),
                                 ZEXT416((uint)(this_00->distrib).domain.pMin.
                                               super_Tuple2<pbrt::Point2,_float>.x));
        auVar9 = vfmadd231ss_fma(auVar9,auVar11,
                                 ZEXT416((uint)(this_00->distrib).domain.pMax.
                                               super_Tuple2<pbrt::Point2,_float>.x));
        fVar4 = auVar9._0_4_ + (this_00->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float>.y;
        fVar4 = (float)((uint)bVar1 * (int)fVar4 + (uint)!bVar1 * (int)(fVar4 / fVar13));
        if ((*(float *)&(this_00->image).p32.alloc.memoryResource <= fVar4) &&
           (fVar4 <= *(float *)&(this_00->image).p32.ptr)) {
          FVar5 = PiecewiseConstant2D::PDF
                            ((PiecewiseConstant2D *)
                             (this_00[1].super_LightBase.renderFromLight.mInv.m[3] + 1),
                             (Point2f *)&stack0xffffffffffffffe8);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)((long)&(this_00->image).p16.nStored + 4);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)((long)&(this_00->image).p32.alloc.memoryResource + 4);
          auVar6 = vsubps_avx(auVar12,auVar9);
          auVar9 = vmovshdup_avx(auVar6);
          *pdfDir = (FVar5 * auVar6._0_4_ * auVar9._0_4_) /
                    (auVar11._0_4_ * auVar11._0_4_ * auVar11._0_4_ *
                    this_00[1].super_LightBase.renderFromLight.mInv.m[2][3]);
          return;
        }
      }
    }
    *pdfDir = 0.0;
    return;
  }
  GoniometricLight::PDF_Le(this_00,ray,pdfPos,pdfDir);
  return;
}

Assistant:

void LightHandle::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    auto pdf = [&](auto ptr) { return ptr->PDF_Le(ray, pdfPos, pdfDir); };
    return Dispatch(pdf);
}